

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O1

int __thiscall bhf::ads::LicenseAccess::ShowOnlineInfo(LicenseAccess *this,ostream *os)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  size_t length;
  pointer this_00;
  uint32_t bytesRead;
  vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_> readBuffer;
  stringstream stream;
  uint32_t local_1fc;
  string local_1f8;
  uint local_1d4;
  vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_> local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1d4 = 0;
  local_1fc = 0;
  lVar2 = AdsDevice::ReadReqEx2(&this->device,0x1010006,0,4,&local_1d4,&local_1fc);
  if (lVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ShowOnlineInfo",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): read license count failed with: 0x",0x26);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
        &local_1f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return 1;
  }
  if ((ulong)local_1d4 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ShowOnlineInfo",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): no license available\n",0x19);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
        &local_1f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return 0;
  }
  std::vector<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>::vector
            (&local_1d0,(ulong)local_1d4,(allocator_type *)local_1b8);
  length = (long)local_1d0.
                 super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)local_1d0.
                 super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = AdsDevice::ReadReqEx2
                    (&this->device,0x1010006,0,length,
                     local_1d0.
                     super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,&local_1fc);
  if (lVar2 == 0) {
    if (length == local_1fc) {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"OrderNo.;Instances;Status;License\n",0x22);
      if (local_1d0.
          super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1d0.
          super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_00 = local_1d0.
                  super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar1 = TcLicenseOnlineInfo::ShowOrderNo(this_00,os,&this->device);
          if (iVar1 != 0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ShowOnlineInfo",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"(): reading order number failed with: 0x",0x28);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
            local_1f8._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
            std::__cxx11::stringbuf::str();
            Logger::Log(3,&local_1f8);
            goto LAB_0011b501;
          }
          local_1b8[0] = (stringstream)0x3b;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1b8,1);
          poVar3 = TcLicenseOnlineInfo::ShowInstances(this_00,os);
          local_1b8[0] = (stringstream)0x3b;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b8,1);
          poVar3 = TcLicenseOnlineInfo::ShowStatus(this_00,os);
          local_1b8[0] = (stringstream)0x3b;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1b8,1);
          iVar1 = TcLicenseOnlineInfo::ShowName(this_00,os,&this->device);
          if (iVar1 != 0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ShowOnlineInfo",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"(): reading license name failed with: 0x",0x28);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
            local_1f8._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
            std::__cxx11::stringbuf::str();
            Logger::Log(3,&local_1f8);
            goto LAB_0011b501;
          }
          local_1b8[0] = (stringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1b8,1);
          this_00 = this_00 + 1;
        } while (this_00 !=
                 local_1d0.
                 super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar4 = (uint)(*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0);
      goto LAB_0011b537;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ShowOnlineInfo",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): read unexpected number of bytes: 0x",0x27);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected: 0x",0xe);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ShowOnlineInfo",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"(): failed with: 0x",0x13);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1f8);
  }
LAB_0011b501:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
      &local_1f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  uVar4 = 1;
LAB_0011b537:
  if (local_1d0.
      super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (TcLicenseOnlineInfo *)0x0) {
    operator_delete(local_1d0.
                    super__Vector_base<bhf::ads::TcLicenseOnlineInfo,_std::allocator<bhf::ads::TcLicenseOnlineInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar4;
}

Assistant:

int LicenseAccess::ShowOnlineInfo(std::ostream& os) const
{
    uint32_t licenseCount = 0;
    uint32_t bytesRead = 0;
    const auto countStatus = device.ReadReqEx2(0x01010006,
                                               0x0,
                                               sizeof(licenseCount),
                                               &licenseCount,
                                               &bytesRead);
    if (ADSERR_NOERR != countStatus) {
        LOG_ERROR(__FUNCTION__ << "(): read license count failed with: 0x" << std::hex << countStatus << '\n');
        return 1;
    }

    licenseCount = bhf::ads::letoh(licenseCount);
    if (0 == licenseCount) {
        LOG_WARN(__FUNCTION__ << "(): no license available\n");
        return 0;
    }

    auto readBuffer = std::vector<TcLicenseOnlineInfo>(licenseCount);
    const auto bufferSize = sizeof(readBuffer[0]) * readBuffer.capacity();
    const auto status = device.ReadReqEx2(0x01010006,
                                          0x0,
                                          bufferSize,
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return 1;
    }

    if (bufferSize != bytesRead) {
        LOG_ERROR(
            __FUNCTION__ << "(): read unexpected number of bytes: 0x" << std::hex << bytesRead << ", expected: 0x" << readBuffer.capacity() <<
                '\n');
        return 1;
    }

    os << "OrderNo.;Instances;Status;License\n";
    for (const auto& next: readBuffer) {
        if (next.ShowOrderNo(os, device)) {
            LOG_ERROR(__FUNCTION__ << "(): reading order number failed with: 0x" << std::hex << status << '\n');
            return 1;
        }

        os << ';';
        next.ShowInstances(os) << ';';
        next.ShowStatus(os) << ';';
        if (next.ShowName(os, device)) {
            LOG_ERROR(__FUNCTION__ << "(): reading license name failed with: 0x" << std::hex << status << '\n');
            return 1;
        }
        os << '\n';
    }
    return !os.good();
}